

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  int in_ECX;
  uint in_EDX;
  char *pcVar9;
  byte *in_RSI;
  long *in_RDI;
  uint in_R8D;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  stbi__uint16 *cur16;
  stbi_uc *cur_2;
  int q;
  stbi_uc scale;
  stbi_uc *in;
  stbi_uc *cur_1;
  int nk;
  int filter;
  stbi_uc *prior;
  stbi_uc *cur;
  int width;
  int filter_bytes;
  int output_bytes;
  int img_n;
  int k;
  stbi__uint32 img_width_bytes;
  stbi__uint32 img_len;
  stbi__uint32 stride;
  stbi__uint32 j;
  stbi__uint32 i;
  stbi__context *s;
  int bytes;
  int in_stack_ffffffffffffff28;
  stbi_uc sVar10;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  byte bVar11;
  int in_stack_ffffffffffffff34;
  undefined2 *local_a0;
  undefined2 *local_98;
  int local_90;
  byte *local_88;
  char *local_80;
  uint local_74;
  long local_70;
  void *local_68;
  uint local_60;
  int local_5c;
  int local_50;
  uint local_40;
  uint local_3c;
  byte *local_18;
  int local_4;
  
  local_5c = 1;
  if (in_stack_00000008 == 0x10) {
    local_5c = 2;
  }
  uVar1 = in_R8D * in_ECX * local_5c;
  iVar5 = *(int *)(*in_RDI + 8);
  iVar2 = in_ECX * local_5c;
  local_5c = iVar5 * local_5c;
  pvVar7 = stbi__malloc_mad3(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0,0x193f34);
  in_RDI[3] = (long)pvVar7;
  if (in_RDI[3] == 0) {
    local_4 = stbi__err("outofmem");
  }
  else {
    iVar3 = stbi__mad3sizes_valid
                      (in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c
                       ,in_stack_ffffffffffffff28);
    if (iVar3 == 0) {
      local_4 = stbi__err("too large");
    }
    else {
      uVar4 = iVar5 * in_R8D * in_stack_00000008 + 7 >> 3;
      if (in_EDX < (uVar4 + 1) * in_R9D) {
        local_4 = stbi__err("not enough pixels");
      }
      else {
        local_60 = in_R8D;
        local_18 = in_RSI;
        for (local_40 = 0; local_40 < in_R9D; local_40 = local_40 + 1) {
          local_68 = (void *)(in_RDI[3] + (ulong)(uVar1 * local_40));
          local_74 = (uint)*local_18;
          if (4 < local_74) {
            iVar5 = stbi__err("invalid filter");
            return iVar5;
          }
          if (in_stack_00000008 < 8) {
            if (in_R8D < uVar4) {
              iVar5 = stbi__err("invalid width");
              return iVar5;
            }
            local_68 = (void *)((long)local_68 + (ulong)(in_R8D * in_ECX - uVar4));
            local_5c = 1;
            local_60 = uVar4;
          }
          local_70 = (long)local_68 - (ulong)uVar1;
          if (local_40 == 0) {
            local_74 = (uint)first_row_filter[(int)local_74];
          }
          for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
            switch(local_74) {
            case 0:
              *(byte *)((long)local_68 + (long)local_50) = local_18[(long)local_50 + 1];
              break;
            case 1:
              *(byte *)((long)local_68 + (long)local_50) = local_18[(long)local_50 + 1];
              break;
            case 2:
              *(byte *)((long)local_68 + (long)local_50) =
                   local_18[(long)local_50 + 1] + *(char *)(local_70 + local_50);
              break;
            case 3:
              *(byte *)((long)local_68 + (long)local_50) =
                   local_18[(long)local_50 + 1] +
                   (char)((int)(uint)*(byte *)(local_70 + local_50) >> 1);
              break;
            case 4:
              bVar11 = local_18[(long)local_50 + 1];
              iVar3 = stbi__paeth(0,(uint)*(byte *)(local_70 + local_50),0);
              *(byte *)((long)local_68 + (long)local_50) = bVar11 + (char)iVar3;
              break;
            case 5:
              *(byte *)((long)local_68 + (long)local_50) = local_18[(long)local_50 + 1];
              break;
            case 6:
              *(byte *)((long)local_68 + (long)local_50) = local_18[(long)local_50 + 1];
            }
          }
          if (in_stack_00000008 == 8) {
            if (iVar5 != in_ECX) {
              *(undefined1 *)((long)local_68 + (long)iVar5) = 0xff;
            }
            local_18 = local_18 + (long)iVar5 + 1;
            local_68 = (void *)((long)local_68 + (long)in_ECX);
            local_70 = local_70 + in_ECX;
          }
          else if (in_stack_00000008 == 0x10) {
            if (iVar5 != in_ECX) {
              *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
              *(undefined1 *)((long)local_68 + (long)(local_5c + 1)) = 0xff;
            }
            local_18 = local_18 + (long)local_5c + 1;
            local_68 = (void *)((long)local_68 + (long)iVar2);
            local_70 = local_70 + iVar2;
          }
          else {
            local_18 = local_18 + 2;
            local_68 = (void *)((long)local_68 + 1);
            local_70 = local_70 + 1;
          }
          if ((in_stack_00000008 < 8) || (iVar5 == in_ECX)) {
            iVar3 = (local_60 - 1) * local_5c;
            switch(local_74) {
            case 0:
              memcpy(local_68,local_18,(long)iVar3);
              break;
            case 1:
              for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
                *(byte *)((long)local_68 + (long)local_50) =
                     local_18[local_50] + *(char *)((long)local_68 + (long)(local_50 - local_5c));
              }
              break;
            case 2:
              for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
                *(byte *)((long)local_68 + (long)local_50) =
                     local_18[local_50] + *(char *)(local_70 + local_50);
              }
              break;
            case 3:
              for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
                *(byte *)((long)local_68 + (long)local_50) =
                     local_18[local_50] +
                     (char)((int)((uint)*(byte *)(local_70 + local_50) +
                                 (uint)*(byte *)((long)local_68 + (long)(local_50 - local_5c))) >> 1
                           );
              }
              break;
            case 4:
              for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
                bVar11 = local_18[local_50];
                iVar6 = stbi__paeth((uint)*(byte *)((long)local_68 + (long)(local_50 - local_5c)),
                                    (uint)*(byte *)(local_70 + local_50),
                                    (uint)*(byte *)(local_70 + (local_50 - local_5c)));
                *(byte *)((long)local_68 + (long)local_50) = bVar11 + (char)iVar6;
              }
              break;
            case 5:
              for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
                *(byte *)((long)local_68 + (long)local_50) =
                     local_18[local_50] +
                     (char)((int)(uint)*(byte *)((long)local_68 + (long)(local_50 - local_5c)) >> 1)
                ;
              }
              break;
            case 6:
              for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
                bVar11 = local_18[local_50];
                iVar6 = stbi__paeth((uint)*(byte *)((long)local_68 + (long)(local_50 - local_5c)),0,
                                    0);
                *(byte *)((long)local_68 + (long)local_50) = bVar11 + (char)iVar6;
              }
            }
            local_18 = local_18 + iVar3;
          }
          else {
            switch(local_74) {
            case 0:
              local_3c = in_R8D - 1;
              while (local_3c != 0) {
                for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
                  *(byte *)((long)local_68 + (long)local_50) = local_18[local_50];
                }
                local_3c = local_3c + -1;
                *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
                local_18 = local_18 + local_5c;
                local_68 = (void *)((long)local_68 + (long)iVar2);
              }
              break;
            case 1:
              local_3c = in_R8D - 1;
              while (local_3c != 0) {
                for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
                  *(byte *)((long)local_68 + (long)local_50) =
                       local_18[local_50] + *(char *)((long)local_68 + (long)(local_50 - iVar2));
                }
                local_3c = local_3c + -1;
                *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
                local_18 = local_18 + local_5c;
                local_68 = (void *)((long)local_68 + (long)iVar2);
              }
              break;
            case 2:
              local_3c = in_R8D - 1;
              while (local_3c != 0) {
                for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
                  *(byte *)((long)local_68 + (long)local_50) =
                       local_18[local_50] + *(char *)(local_70 + local_50);
                }
                local_3c = local_3c + -1;
                *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
                local_18 = local_18 + local_5c;
                local_68 = (void *)((long)local_68 + (long)iVar2);
                local_70 = local_70 + iVar2;
              }
              break;
            case 3:
              local_3c = in_R8D - 1;
              while (local_3c != 0) {
                for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
                  *(byte *)((long)local_68 + (long)local_50) =
                       local_18[local_50] +
                       (char)((int)((uint)*(byte *)(local_70 + local_50) +
                                   (uint)*(byte *)((long)local_68 + (long)(local_50 - iVar2))) >> 1)
                  ;
                }
                local_3c = local_3c + -1;
                *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
                local_18 = local_18 + local_5c;
                local_68 = (void *)((long)local_68 + (long)iVar2);
                local_70 = local_70 + iVar2;
              }
              break;
            case 4:
              local_3c = in_R8D - 1;
              while (local_3c != 0) {
                for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
                  bVar11 = local_18[local_50];
                  iVar3 = stbi__paeth((uint)*(byte *)((long)local_68 + (long)(local_50 - iVar2)),
                                      (uint)*(byte *)(local_70 + local_50),
                                      (uint)*(byte *)(local_70 + (local_50 - iVar2)));
                  *(byte *)((long)local_68 + (long)local_50) = bVar11 + (char)iVar3;
                }
                local_3c = local_3c + -1;
                *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
                local_18 = local_18 + local_5c;
                local_68 = (void *)((long)local_68 + (long)iVar2);
                local_70 = local_70 + iVar2;
              }
              break;
            case 5:
              local_3c = in_R8D - 1;
              while (local_3c != 0) {
                for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
                  *(byte *)((long)local_68 + (long)local_50) =
                       local_18[local_50] +
                       (char)((int)(uint)*(byte *)((long)local_68 + (long)(local_50 - iVar2)) >> 1);
                }
                local_3c = local_3c + -1;
                *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
                local_18 = local_18 + local_5c;
                local_68 = (void *)((long)local_68 + (long)iVar2);
              }
              break;
            case 6:
              local_3c = in_R8D - 1;
              while (local_3c != 0) {
                for (local_50 = 0; local_50 < local_5c; local_50 = local_50 + 1) {
                  bVar11 = local_18[local_50];
                  iVar3 = stbi__paeth((uint)*(byte *)((long)local_68 + (long)(local_50 - iVar2)),0,0
                                     );
                  *(byte *)((long)local_68 + (long)local_50) = bVar11 + (char)iVar3;
                }
                local_3c = local_3c + -1;
                *(undefined1 *)((long)local_68 + (long)local_5c) = 0xff;
                local_18 = local_18 + local_5c;
                local_68 = (void *)((long)local_68 + (long)iVar2);
              }
            }
            if (in_stack_00000008 == 0x10) {
              local_68 = (void *)(in_RDI[3] + (ulong)(uVar1 * local_40));
              for (local_3c = 0; local_3c < in_R8D; local_3c = local_3c + 1) {
                *(undefined1 *)((long)local_68 + (long)(local_5c + 1)) = 0xff;
                local_68 = (void *)((long)local_68 + (long)iVar2);
              }
            }
          }
        }
        if (in_stack_00000008 < 8) {
          for (local_40 = 0; local_40 < in_R9D; local_40 = local_40 + 1) {
            local_80 = (char *)(in_RDI[3] + (ulong)(uVar1 * local_40));
            local_88 = (byte *)((in_RDI[3] + (ulong)(uVar1 * local_40) + (ulong)(in_R8D * in_ECX)) -
                               (ulong)uVar4);
            if (in_stack_00000010 == 0) {
              sVar10 = ""[in_stack_00000008];
            }
            else {
              sVar10 = '\x01';
            }
            if (in_stack_00000008 == 4) {
              for (local_50 = in_R8D * iVar5; 1 < local_50; local_50 = local_50 + -2) {
                pcVar9 = local_80 + 1;
                *local_80 = sVar10 * (char)((int)(uint)*local_88 >> 4);
                local_80 = local_80 + 2;
                *pcVar9 = sVar10 * (*local_88 & 0xf);
                local_88 = local_88 + 1;
              }
              if (0 < local_50) {
                *local_80 = sVar10 * (char)((int)(uint)*local_88 >> 4);
              }
            }
            else if (in_stack_00000008 == 2) {
              for (local_50 = in_R8D * iVar5; 3 < local_50; local_50 = local_50 + -4) {
                *local_80 = sVar10 * (char)((int)(uint)*local_88 >> 6);
                local_80[1] = sVar10 * ((byte)((int)(uint)*local_88 >> 4) & 3);
                pcVar9 = local_80 + 3;
                local_80[2] = sVar10 * ((byte)((int)(uint)*local_88 >> 2) & 3);
                local_80 = local_80 + 4;
                *pcVar9 = sVar10 * (*local_88 & 3);
                local_88 = local_88 + 1;
              }
              if (0 < local_50) {
                *local_80 = sVar10 * (char)((int)(uint)*local_88 >> 6);
                local_80 = local_80 + 1;
              }
              if (1 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 4) & 3);
                local_80 = local_80 + 1;
              }
              if (2 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 2) & 3);
              }
            }
            else if (in_stack_00000008 == 1) {
              for (local_50 = in_R8D * iVar5; 7 < local_50; local_50 = local_50 + -8) {
                *local_80 = sVar10 * (char)((int)(uint)*local_88 >> 7);
                local_80[1] = sVar10 * ((byte)((int)(uint)*local_88 >> 6) & 1);
                local_80[2] = sVar10 * ((byte)((int)(uint)*local_88 >> 5) & 1);
                local_80[3] = sVar10 * ((byte)((int)(uint)*local_88 >> 4) & 1);
                local_80[4] = sVar10 * ((byte)((int)(uint)*local_88 >> 3) & 1);
                local_80[5] = sVar10 * ((byte)((int)(uint)*local_88 >> 2) & 1);
                pcVar9 = local_80 + 7;
                local_80[6] = sVar10 * ((byte)((int)(uint)*local_88 >> 1) & 1);
                local_80 = local_80 + 8;
                *pcVar9 = sVar10 * (*local_88 & 1);
                local_88 = local_88 + 1;
              }
              if (0 < local_50) {
                *local_80 = sVar10 * (char)((int)(uint)*local_88 >> 7);
                local_80 = local_80 + 1;
              }
              if (1 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 6) & 1);
                local_80 = local_80 + 1;
              }
              if (2 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 5) & 1);
                local_80 = local_80 + 1;
              }
              if (3 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 4) & 1);
                local_80 = local_80 + 1;
              }
              if (4 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 3) & 1);
                local_80 = local_80 + 1;
              }
              if (5 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 2) & 1);
                local_80 = local_80 + 1;
              }
              if (6 < local_50) {
                *local_80 = sVar10 * ((byte)((int)(uint)*local_88 >> 1) & 1);
              }
            }
            if (iVar5 != in_ECX) {
              lVar8 = in_RDI[3] + (ulong)(uVar1 * local_40);
              if (iVar5 == 1) {
                for (local_90 = in_R8D - 1; -1 < local_90; local_90 = local_90 + -1) {
                  *(undefined1 *)(lVar8 + (local_90 * 2 + 1)) = 0xff;
                  *(undefined1 *)(lVar8 + (local_90 << 1)) = *(undefined1 *)(lVar8 + local_90);
                }
              }
              else {
                for (local_90 = in_R8D - 1; -1 < local_90; local_90 = local_90 + -1) {
                  *(undefined1 *)(lVar8 + (local_90 * 4 + 3)) = 0xff;
                  *(undefined1 *)(lVar8 + (local_90 * 4 + 2)) =
                       *(undefined1 *)(lVar8 + (local_90 * 3 + 2));
                  *(undefined1 *)(lVar8 + (local_90 * 4 + 1)) =
                       *(undefined1 *)(lVar8 + (local_90 * 3 + 1));
                  *(undefined1 *)(lVar8 + (local_90 << 2)) = *(undefined1 *)(lVar8 + local_90 * 3);
                }
              }
            }
          }
        }
        else if (in_stack_00000008 == 0x10) {
          local_a0 = (undefined2 *)in_RDI[3];
          local_98 = local_a0;
          for (local_3c = 0; local_3c < in_R8D * in_R9D * in_ECX; local_3c = local_3c + 1) {
            *local_a0 = CONCAT11(*(undefined1 *)local_98,*(undefined1 *)((long)local_98 + 1));
            local_a0 = local_a0 + 1;
            local_98 = local_98 + 1;
          }
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }